

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.cpp
# Opt level: O0

void __thiscall
rsg::ValueRange::ValueRange
          (ValueRange *this,VariableType *type,ConstValueAccess *minVal,ConstValueAccess *maxVal)

{
  int iVar1;
  ConstStridedValueAccess<1> local_78;
  StridedValueRead<1> local_68;
  ConstStridedValueAccess<1> local_58;
  StridedValueRead<1> local_48;
  allocator<rsg::Scalar> local_36;
  allocator<rsg::Scalar> local_35 [13];
  ConstValueAccess *local_28;
  ConstValueAccess *maxVal_local;
  ConstValueAccess *minVal_local;
  VariableType *type_local;
  ValueRange *this_local;
  
  local_28 = maxVal;
  maxVal_local = minVal;
  minVal_local = (ConstValueAccess *)type;
  type_local = &this->m_type;
  VariableType::VariableType(&this->m_type,type);
  iVar1 = VariableType::getScalarSize((VariableType *)minVal_local);
  std::allocator<rsg::Scalar>::allocator(local_35);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_min,(long)iVar1,local_35);
  std::allocator<rsg::Scalar>::~allocator(local_35);
  iVar1 = VariableType::getScalarSize((VariableType *)minVal_local);
  std::allocator<rsg::Scalar>::allocator(&local_36);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar1,&local_36)
  ;
  std::allocator<rsg::Scalar>::~allocator(&local_36);
  local_48 = ConstStridedValueAccess<1>::value(maxVal_local);
  local_58 = (ConstStridedValueAccess<1>)getMin(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_58,&local_48);
  local_68 = ConstStridedValueAccess<1>::value(local_28);
  local_78 = (ConstStridedValueAccess<1>)getMax(this);
  StridedValueAccess<1>::operator=((StridedValueAccess<1> *)&local_78,&local_68);
  return;
}

Assistant:

ValueRange::ValueRange (const VariableType& type, const ConstValueAccess& minVal, const ConstValueAccess& maxVal)
	: m_type		(type)
	, m_min			(type.getScalarSize())
	, m_max			(type.getScalarSize())
{
	getMin() = minVal.value();
	getMax() = maxVal.value();
}